

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O1

UBool __thiscall
icu_63::CollationBuilder::mergeCompositeIntoString
          (CollationBuilder *this,UnicodeString *nfdString,int32_t indexAfterLastStarter,
          UChar32 composite,UnicodeString *decomp,UnicodeString *newNFDString,
          UnicodeString *newString,UErrorCode *errorCode)

{
  ushort uVar1;
  short sVar2;
  int32_t iVar3;
  bool bVar4;
  byte bVar5;
  int32_t srcStart;
  uint uVar6;
  int iVar7;
  uint srcChar;
  int iVar8;
  UnicodeString *this_00;
  char16_t *srcChars;
  int32_t iVar9;
  int iVar10;
  int local_4c;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    srcStart = UnicodeString::moveIndex32(decomp,0,1);
    uVar1 = (decomp->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      iVar9 = (decomp->fUnion).fFields.fLength;
    }
    else {
      iVar9 = (int)(short)uVar1 >> 5;
    }
    if (srcStart == iVar9) {
      return '\0';
    }
    if (((int)(short)uVar1 & 1U) == 0) {
      iVar3 = srcStart;
      if (iVar9 < srcStart) {
        iVar3 = iVar9;
      }
      iVar7 = 0;
      if (-1 < srcStart) {
        iVar7 = iVar3;
      }
      if ((uVar1 & 2) == 0) {
        srcChars = (decomp->fUnion).fFields.fArray;
      }
      else {
        srcChars = (decomp->fUnion).fStackFields.fBuffer;
      }
      bVar5 = UnicodeString::doCompare
                        (nfdString,indexAfterLastStarter,0x7fffffff,srcChars,iVar7,iVar9 - iVar7);
    }
    else {
      bVar5 = ~*(byte *)&nfdString->fUnion & 1;
    }
    if (bVar5 != 0) {
      UnicodeString::unBogus(newNFDString);
      sVar2 = (newNFDString->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar9 = (newNFDString->fUnion).fFields.fLength;
      }
      else {
        iVar9 = (int)sVar2 >> 5;
      }
      iVar7 = 0;
      UnicodeString::doReplace(newNFDString,0,iVar9,nfdString,0,indexAfterLastStarter);
      UnicodeString::unBogus(newString);
      sVar2 = (newString->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar9 = (newString->fUnion).fFields.fLength;
      }
      else {
        iVar9 = (int)sVar2 >> 5;
      }
      this_00 = UnicodeString::doReplace
                          (newString,0,iVar9,nfdString,0,indexAfterLastStarter - srcStart);
      UnicodeString::append(this_00,composite);
      uVar6 = 0xffffffff;
      iVar10 = 0;
      local_4c = indexAfterLastStarter;
      do {
        bVar5 = (byte)iVar7;
        if ((int)uVar6 < 0) {
          sVar2 = (nfdString->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar7 = (nfdString->fUnion).fFields.fLength;
          }
          else {
            iVar7 = (int)sVar2 >> 5;
          }
          if (iVar7 <= local_4c) goto LAB_0023121b;
          uVar6 = UnicodeString::char32At(nfdString,local_4c);
          iVar7 = (*(this->nfd->super_UObject)._vptr_UObject[10])(this->nfd,(ulong)uVar6);
        }
        bVar5 = (byte)iVar7;
        sVar2 = (decomp->fUnion).fStackFields.fLengthAndFlags;
        if (sVar2 < 0) {
          iVar8 = (decomp->fUnion).fFields.fLength;
        }
        else {
          iVar8 = (int)sVar2 >> 5;
        }
        if (iVar8 <= srcStart) {
LAB_0023121b:
          if (-1 < (int)uVar6) {
            if (bVar5 < (byte)iVar10) {
              return '\0';
            }
            UnicodeString::doAppend(newNFDString,nfdString,local_4c,0x7fffffff);
            UnicodeString::doAppend(newString,nfdString,local_4c,0x7fffffff);
            return '\x01';
          }
          sVar2 = (decomp->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar7 = (decomp->fUnion).fFields.fLength;
          }
          else {
            iVar7 = (int)sVar2 >> 5;
          }
          if (srcStart < iVar7) {
            UnicodeString::doAppend(newNFDString,decomp,srcStart,0x7fffffff);
            return '\x01';
          }
          return '\x01';
        }
        srcChar = UnicodeString::char32At(decomp,srcStart);
        iVar10 = (*(this->nfd->super_UObject)._vptr_UObject[10])(this->nfd,(ulong)srcChar);
        if ((byte)((byte)iVar10 - 1) < bVar5) {
          if ((byte)iVar10 < bVar5) {
            UnicodeString::append(newNFDString,srcChar);
            iVar8 = 2 - (uint)(srcChar < 0x10000);
          }
          else {
            if (srcChar != uVar6) goto LAB_00231203;
            UnicodeString::append(newNFDString,srcChar);
            iVar8 = 2 - (uint)(srcChar < 0x10000);
            local_4c = local_4c + iVar8;
            uVar6 = 0xffffffff;
          }
          srcStart = srcStart + iVar8;
          bVar4 = true;
        }
        else {
LAB_00231203:
          bVar4 = false;
        }
      } while (bVar4);
    }
  }
  return '\0';
}

Assistant:

UBool
CollationBuilder::mergeCompositeIntoString(const UnicodeString &nfdString,
                                           int32_t indexAfterLastStarter,
                                           UChar32 composite, const UnicodeString &decomp,
                                           UnicodeString &newNFDString, UnicodeString &newString,
                                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(nfdString.char32At(indexAfterLastStarter - 1) == decomp.char32At(0));
    int32_t lastStarterLength = decomp.moveIndex32(0, 1);
    if(lastStarterLength == decomp.length()) {
        // Singleton decompositions should be found by addWithClosure()
        // and the CanonicalIterator, so we can ignore them here.
        return FALSE;
    }
    if(nfdString.compare(indexAfterLastStarter, 0x7fffffff,
                         decomp, lastStarterLength, 0x7fffffff) == 0) {
        // same strings, nothing new to be found here
        return FALSE;
    }

    // Make new FCD strings that combine a composite, or its decomposition,
    // into the nfdString's last starter and the combining marks following it.
    // Make an NFD version, and a version with the composite.
    newNFDString.setTo(nfdString, 0, indexAfterLastStarter);
    newString.setTo(nfdString, 0, indexAfterLastStarter - lastStarterLength).append(composite);

    // The following is related to discontiguous contraction matching,
    // but builds only FCD strings (or else returns FALSE).
    int32_t sourceIndex = indexAfterLastStarter;
    int32_t decompIndex = lastStarterLength;
    // Small optimization: We keep the source character across loop iterations
    // because we do not always consume it,
    // and then need not fetch it again nor look up its combining class again.
    UChar32 sourceChar = U_SENTINEL;
    // The cc variables need to be declared before the loop so that at the end
    // they are set to the last combining classes seen.
    uint8_t sourceCC = 0;
    uint8_t decompCC = 0;
    for(;;) {
        if(sourceChar < 0) {
            if(sourceIndex >= nfdString.length()) { break; }
            sourceChar = nfdString.char32At(sourceIndex);
            sourceCC = nfd.getCombiningClass(sourceChar);
            U_ASSERT(sourceCC != 0);
        }
        // We consume a decomposition character in each iteration.
        if(decompIndex >= decomp.length()) { break; }
        UChar32 decompChar = decomp.char32At(decompIndex);
        decompCC = nfd.getCombiningClass(decompChar);
        // Compare the two characters and their combining classes.
        if(decompCC == 0) {
            // Unable to merge because the source contains a non-zero combining mark
            // but the composite's decomposition contains another starter.
            // The strings would not be equivalent.
            return FALSE;
        } else if(sourceCC < decompCC) {
            // Composite + sourceChar would not be FCD.
            return FALSE;
        } else if(decompCC < sourceCC) {
            newNFDString.append(decompChar);
            decompIndex += U16_LENGTH(decompChar);
        } else if(decompChar != sourceChar) {
            // Blocked because same combining class.
            return FALSE;
        } else {  // match: decompChar == sourceChar
            newNFDString.append(decompChar);
            decompIndex += U16_LENGTH(decompChar);
            sourceIndex += U16_LENGTH(decompChar);
            sourceChar = U_SENTINEL;
        }
    }
    // We are at the end of at least one of the two inputs.
    if(sourceChar >= 0) {  // more characters from nfdString but not from decomp
        if(sourceCC < decompCC) {
            // Appending the next source character to the composite would not be FCD.
            return FALSE;
        }
        newNFDString.append(nfdString, sourceIndex, 0x7fffffff);
        newString.append(nfdString, sourceIndex, 0x7fffffff);
    } else if(decompIndex < decomp.length()) {  // more characters from decomp, not from nfdString
        newNFDString.append(decomp, decompIndex, 0x7fffffff);
    }
    U_ASSERT(nfd.isNormalized(newNFDString, errorCode));
    U_ASSERT(fcd.isNormalized(newString, errorCode));
    U_ASSERT(nfd.normalize(newString, errorCode) == newNFDString);  // canonically equivalent
    return TRUE;
}